

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void * crnd::crnd_malloc(size_t size,size_t *pActual_size)

{
  void *pvVar1;
  ulong uVar2;
  char *p_msg;
  ulong uVar3;
  size_t actual_size;
  
  uVar2 = size + 3 & 0xfffffffffffffffc;
  uVar3 = 4;
  if (uVar2 != 0) {
    uVar3 = uVar2;
  }
  if (uVar3 < 0x7fff0001) {
    actual_size = uVar3;
    pvVar1 = (void *)(*(code *)g_pRealloc)(0,uVar3,&actual_size,1,g_pUser_data);
    if (pActual_size != (size_t *)0x0) {
      *pActual_size = actual_size;
    }
    if (uVar3 <= actual_size && pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    p_msg = "crnd_malloc: out of memory";
  }
  else {
    p_msg = "crnd_malloc: size too big";
  }
  crnd_mem_error(p_msg);
  return (void *)0x0;
}

Assistant:

void* crnd_malloc(size_t size, size_t* pActual_size)
    {
        size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
        if (!size)
            size = sizeof(uint32);

        if (size > MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnd_mem_error("crnd_malloc: size too big");
            return NULL;
        }

        size_t actual_size = size;
        uint8* p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));

        if (pActual_size)
            *pActual_size = actual_size;

        if ((!p_new) || (actual_size < size))
        {
            crnd_mem_error("crnd_malloc: out of memory");
            return NULL;
        }

        CRND_ASSERT(((uint32) reinterpret_cast<uintptr_t>(p_new) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) == 0);

        return p_new;
    }